

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O0

int __thiscall
LASreadItemCompressed_POINT10_v2::init(LASreadItemCompressed_POINT10_v2 *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *ctx_00;
  uint local_24;
  U32 i;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_POINT10_v2 *this_local;
  
  ctx_00 = ctx;
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    StreamingMedian5::init(this->last_x_diff_median5 + local_24,ctx_00);
    StreamingMedian5::init(this->last_y_diff_median5 + local_24,ctx_00);
    this->last_intensity[local_24] = 0;
    this->last_height[local_24 >> 1] = 0;
  }
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_changed_values,(U32 *)0x0);
  IntegerCompressor::initDecompressor(this->ic_intensity);
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_scan_angle_rank[0],(U32 *)0x0);
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_scan_angle_rank[1],(U32 *)0x0);
  IntegerCompressor::initDecompressor(this->ic_point_source_ID);
  for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
    if (this->m_bit_byte[local_24] != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::initSymbolModel(this->dec,this->m_bit_byte[local_24],(U32 *)0x0);
    }
    if (this->m_classification[local_24] != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::initSymbolModel(this->dec,this->m_classification[local_24],(U32 *)0x0);
    }
    if (this->m_user_data[local_24] != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::initSymbolModel(this->dec,this->m_user_data[local_24],(U32 *)0x0);
    }
  }
  IntegerCompressor::initDecompressor(this->ic_dx);
  IntegerCompressor::initDecompressor(this->ic_dy);
  IntegerCompressor::initDecompressor(this->ic_z);
  *(undefined8 *)this->last_item = *(undefined8 *)ctx;
  *(undefined8 *)(this->last_item + 8) = *(undefined8 *)(ctx + 8);
  *(undefined4 *)(this->last_item + 0x10) = *(undefined4 *)(ctx + 0x10);
  this->last_item[0xc] = '\0';
  this->last_item[0xd] = '\0';
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

BOOL LASreadItemCompressed_POINT10_v2::init(const U8* item, U32& context)
{
  U32 i;

  /* init state */
  for (i=0; i < 16; i++)
  {
    last_x_diff_median5[i].init();
    last_y_diff_median5[i].init();
    last_intensity[i] = 0;
    last_height[i/2] = 0;
  }

  /* init models and integer compressors */
  dec->initSymbolModel(m_changed_values);
  ic_intensity->initDecompressor();
  dec->initSymbolModel(m_scan_angle_rank[0]);
  dec->initSymbolModel(m_scan_angle_rank[1]);
  ic_point_source_ID->initDecompressor();
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) dec->initSymbolModel(m_bit_byte[i]);
    if (m_classification[i]) dec->initSymbolModel(m_classification[i]);
    if (m_user_data[i]) dec->initSymbolModel(m_user_data[i]);
  }
  ic_dx->initDecompressor();
  ic_dy->initDecompressor();
  ic_z->initDecompressor();

  /* init last item */
  memcpy(last_item, item, 20);

  /* but set intensity to zero */ 
  last_item[12] = 0;
  last_item[13] = 0;

  return TRUE;
}